

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

RandomSampler *
pbrt::RandomSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  string local_48;
  RandomSampler *pRVar5;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"pixelsamples","");
  iVar2 = ParameterDictionary::GetOneInt(parameters,&local_48,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(char *)(Options + 0x1c) == '\x01') {
    iVar2 = *(int *)(Options + 0x18);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"seed","");
  iVar3 = ParameterDictionary::GetOneInt(parameters,&local_48,*(int *)(Options + 4));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pRVar5 = (RandomSampler *)CONCAT44(extraout_var,iVar4);
  pRVar5->samplesPerPixel = iVar2;
  pRVar5->seed = iVar3;
  (pRVar5->rng).state = 0x853c49e6748fea9b;
  (pRVar5->rng).inc = 0xda3e39cb94b95bdb;
  return pRVar5;
}

Assistant:

RandomSampler *RandomSampler::Create(const ParameterDictionary &parameters,
                                     const FileLoc *loc, Allocator alloc) {
    int ns = parameters.GetOneInt("pixelsamples", 4);
    if (Options->pixelSamples)
        ns = *Options->pixelSamples;
    int seed = parameters.GetOneInt("seed", Options->seed);
    return alloc.new_object<RandomSampler>(ns, seed);
}